

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_ring_buffer.cc
# Opt level: O2

void __thiscall
webrtc::AudioRingBuffer::Write(AudioRingBuffer *this,float **data,size_t channels,size_t frames)

{
  int line;
  string *result;
  ulong uVar1;
  size_t frames_local;
  size_t written;
  size_t channels_local;
  FatalMessage local_1a8;
  
  local_1a8._0_8_ =
       (long)(this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->buffers_).super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  frames_local = frames;
  channels_local = channels;
  result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     ((unsigned_long *)&local_1a8,&channels_local,"buffers_.size() == channels");
  if (result == (string *)0x0) {
    uVar1 = 0;
    while( true ) {
      if (channels_local <= uVar1) {
        return;
      }
      written = WebRtc_WriteBuffer((this->buffers_).
                                   super__Vector_base<RingBuffer_*,_std::allocator<RingBuffer_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar1],data[uVar1],
                                   frames_local);
      result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                         (&written,&frames_local,"written == frames");
      if (result != (string *)0x0) break;
      uVar1 = uVar1 + 1;
    }
    line = 0x24;
  }
  else {
    line = 0x21;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_ring_buffer.cc"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void AudioRingBuffer::Write(const float* const* data, size_t channels,
                            size_t frames) {
  RTC_DCHECK_EQ(buffers_.size(), channels);
  for (size_t i = 0; i < channels; ++i) {
    const size_t written = WebRtc_WriteBuffer(buffers_[i], data[i], frames);
    RTC_CHECK_EQ(written, frames);
  }
}